

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty.cpp
# Opt level: O1

string * __thiscall
cli::getPrettySize_abi_cxx11_(string *__return_storage_ptr__,cli *this,uint32_t size)

{
  long lVar1;
  uint uVar2;
  long *plVar3;
  size_type *psVar4;
  bool bVar5;
  double dVar6;
  long *local_1b8 [2];
  long local_1a8 [2];
  stringstream local_198 [16];
  long local_188;
  undefined8 local_180 [2];
  uint auStack_170 [22];
  ios_base local_118 [264];
  
  dVar6 = (double)((ulong)this & 0xffffffff);
  if (0x3ff < (uint)this) {
    uVar2 = 0;
    do {
      dVar6 = dVar6 * 0.0009765625;
      if (dVar6 < 1024.0) break;
      bVar5 = uVar2 < 3;
      uVar2 = uVar2 + 1;
    } while (bVar5);
  }
  std::__cxx11::stringstream::stringstream(local_198);
  *(uint *)((long)auStack_170 + *(long *)(local_188 + -0x18)) =
       *(uint *)((long)auStack_170 + *(long *)(local_188 + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)((long)local_180 + *(long *)(local_188 + -0x18)) = 2;
  std::ostream::_M_insert<double>(dVar6);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  plVar3 = (long *)std::__cxx11::string::append((char *)local_1b8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar4) {
    lVar1 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0],local_1a8[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getPrettySize(std::uint32_t size)
	{
		static const char *suffixes[] = { " B", " KiB", " MiB", " GiB", " TiB" };
		static const int suffixesSize = 5;

		int suffIndex = 0;
		double newSize = size;

		while ((newSize >= 1024.0) && (suffIndex < suffixesSize - 1))
		{
			++suffIndex;
			newSize /= 1024.0;
		}

		return toString(newSize, 2) + suffixes[suffIndex];
	}